

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O2

int fillword(int f,int n)

{
  char cVar1;
  mgwin *pmVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  line *plVar6;
  ulong uVar7;
  ulong uVar8;
  
  do {
    uVar8 = 0;
    iVar5 = fillcol;
    for (iVar3 = 0; iVar3 <= iVar5; iVar3 = iVar3 + 1) {
      if (uVar8 == (uint)curwp->w_doto) {
        iVar5 = selfinsert(f,n);
        return iVar5;
      }
      uVar7 = (ulong)(byte)curwp->w_dotp->l_text[uVar8];
      if (uVar7 == 9) {
        iVar3 = ntabstop(iVar3,curwp->w_bufp->b_tabw);
        iVar5 = fillcol;
      }
      else {
        iVar3 = iVar3 + (uint)(((byte)cinfo[uVar7] >> 3 & 1) != 0);
      }
      uVar8 = uVar8 + 1;
    }
    plVar6 = curwp->w_dotp;
    iVar5 = 0;
    if (curwp->w_doto != plVar6->l_used) {
      selfinsert(f,n);
      plVar6 = curwp->w_dotp;
      iVar5 = plVar6->l_used - curwp->w_doto;
    }
    curwp->w_doto = (int)uVar8;
    if ((plVar6->l_text[uVar8 & 0xffffffff] != ' ') && (plVar6->l_text[uVar8 & 0xffffffff] != '\t'))
    {
      while( true ) {
        backchar(8,1);
        uVar8 = (ulong)curwp->w_doto;
        cVar1 = curwp->w_dotp->l_text[uVar8];
        if (cVar1 == '\t') break;
        if ((cVar1 == ' ') || (curwp->w_doto < 1)) break;
      }
    }
    if ((int)uVar8 == 0) {
      do {
        forwchar(8,1);
        cVar1 = curwp->w_dotp->l_text[curwp->w_doto];
        if ((cVar1 == '\t') || (cVar1 == ' ')) break;
      } while (curwp->w_doto < curwp->w_dotp->l_used);
    }
    delwhite(8,1);
    lnewline();
    pmVar2 = curwp;
    iVar4 = curwp->w_dotp->l_used - iVar5;
    iVar3 = 0;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    curwp->w_doto = iVar3;
    pmVar2->w_rflag = pmVar2->w_rflag | 2;
    if ((iVar5 != 0) || (iVar4 < 1)) {
      return 1;
    }
  } while( true );
}

Assistant:

int
fillword(int f, int n)
{
	char	c;
	int	col, i, nce;

	for (i = col = 0; col <= fillcol; ++i, ++col) {
		if (i == curwp->w_doto)
			return selfinsert(f, n);
		c = lgetc(curwp->w_dotp, i);
		if (c == '\t')
			col = ntabstop(col, curwp->w_bufp->b_tabw);
		else if (ISCTRL(c) != FALSE)
			++col;
	}
	if (curwp->w_doto != llength(curwp->w_dotp)) {
		(void)selfinsert(f, n);
		nce = llength(curwp->w_dotp) - curwp->w_doto;
	} else
		nce = 0;
	curwp->w_doto = i;

	if ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' && c != '\t')
		do {
			(void)backchar(FFRAND, 1);
		} while ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' &&
		    c != '\t' && curwp->w_doto > 0);

	if (curwp->w_doto == 0)
		do {
			(void)forwchar(FFRAND, 1);
		} while ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' &&
		    c != '\t' && curwp->w_doto < llength(curwp->w_dotp));

	(void)delwhite(FFRAND, 1);
	(void)lnewline();
	i = llength(curwp->w_dotp) - nce;
	curwp->w_doto = i > 0 ? i : 0;
	curwp->w_rflag |= WFMOVE;
	if (nce == 0 && curwp->w_doto != 0)
		return (fillword(f, n));
	return (TRUE);
}